

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<float,_4,_2> *
tcu::operator/(Matrix<float,_4,_2> *__return_storage_ptr__,Matrix<float,_4,_2> *a,
              Matrix<float,_4,_2> *b)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  undefined4 local_2c;
  undefined4 local_28;
  int row;
  int col;
  Matrix<float,_4,_2> *b_local;
  Matrix<float,_4,_2> *a_local;
  Matrix<float,_4,_2> *res;
  
  Matrix<float,_4,_2>::Matrix(__return_storage_ptr__);
  for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      pfVar3 = Matrix<float,_4,_2>::operator()(a,local_2c,local_28);
      fVar1 = *pfVar3;
      pfVar3 = Matrix<float,_4,_2>::operator()(b,local_2c,local_28);
      fVar2 = *pfVar3;
      pfVar3 = Matrix<float,_4,_2>::operator()(__return_storage_ptr__,local_2c,local_28);
      *pfVar3 = fVar1 / fVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows, Cols> operator/ (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) / b(row, col);
	return res;
}